

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::setQubits
          (QRotationGate2<std::complex<double>_> *this,int *qubits)

{
  int iVar1;
  int *piVar2;
  reference pvVar3;
  int *qubits_local;
  QRotationGate2<std::complex<double>_> *this_local;
  
  if (*qubits < 0) {
    __assert_fail("qubits[0] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/QRotationGate2.hpp"
                  ,0x8f,
                  "virtual void qclab::qgates::QRotationGate2<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
                 );
  }
  if (-1 < qubits[1]) {
    if (*qubits != qubits[1]) {
      piVar2 = std::min<int>(qubits,qubits + 1);
      iVar1 = *piVar2;
      pvVar3 = std::array<int,_2UL>::operator[](&this->qubits_,0);
      *pvVar3 = iVar1;
      piVar2 = std::max<int>(qubits,qubits + 1);
      iVar1 = *piVar2;
      pvVar3 = std::array<int,_2UL>::operator[](&this->qubits_,1);
      *pvVar3 = iVar1;
      return;
    }
    __assert_fail("qubits[0] != qubits[1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/QRotationGate2.hpp"
                  ,0x90,
                  "virtual void qclab::qgates::QRotationGate2<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
                 );
  }
  __assert_fail("qubits[1] >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/QRotationGate2.hpp"
                ,0x8f,
                "virtual void qclab::qgates::QRotationGate2<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
               );
}

Assistant:

inline void setQubits( const int* qubits ) override {
          assert( qubits[0] >= 0 ) ; assert( qubits[1] >= 0 ) ;
          assert( qubits[0] != qubits[1] ) ;
          qubits_[0] = std::min( qubits[0] , qubits[1] ) ;
          qubits_[1] = std::max( qubits[0] , qubits[1] ) ;
        }